

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  double v_00;
  bool bVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int local_a4;
  bool local_9f;
  int local_98;
  bool local_91;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  longlong v_cur;
  bool is_already_past_limits_and_pushing_outward;
  ImVec2 IStack_60;
  bool is_just_activated;
  int local_58;
  float local_54;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiContext *pIStack_48;
  ImGuiAxis axis;
  ImGuiContext *g;
  char *pcStack_38;
  ImGuiSliderFlags flags_local;
  char *format_local;
  longlong v_max_local;
  longlong v_min_local;
  double *pdStack_18;
  float v_speed_local;
  longlong *v_local;
  ImGuiDataType data_type_local;
  
  pIStack_48 = GImGui;
  adjust_delta = (float)(uint)((flags & 0x100000U) != 0);
  decimal_precision._3_1_ = v_min < v_max;
  decimal_precision._2_1_ = (flags & 0x20U) != 0;
  local_91 = data_type == 8 || data_type == 9;
  decimal_precision._1_1_ = local_91;
  v_min_local._4_4_ = v_speed;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && ((bool)decimal_precision._3_1_)) &&
     ((float)(v_max - v_min) < 3.4028235e+38)) {
    v_min_local._4_4_ = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  local_54 = 0.0;
  g._4_4_ = flags;
  pcStack_38 = format;
  format_local = (char *)v_max;
  v_max_local = v_min;
  pdStack_18 = (double *)v;
  v_local._0_4_ = data_type;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIStack_48->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar2 = ImVec2::operator[](&(pIStack_48->IO).MouseDelta,(long)(int)adjust_delta);
    local_54 = *pfVar2;
    if (((pIStack_48->IO).KeyAlt & 1U) != 0) {
      local_54 = local_54 * 0.01;
    }
    if (((pIStack_48->IO).KeyShift & 1U) != 0) {
      local_54 = local_54 * 10.0;
    }
  }
  else if (pIStack_48->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((decimal_precision._1_1_ & 1) == 0) {
      local_98 = 0;
    }
    else {
      local_98 = ImParseFormatPrecision(pcStack_38,3);
    }
    local_58 = local_98;
    IStack_60 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
    pfVar2 = ImVec2::operator[](&stack0xffffffffffffffa0,(long)(int)adjust_delta);
    fVar4 = v_min_local._4_4_;
    local_54 = *pfVar2;
    fVar3 = GetMinimumStepAtDecimalPrecision(local_58);
    v_min_local._4_4_ = ImMax<float>(fVar4,fVar3);
  }
  local_54 = v_min_local._4_4_ * local_54;
  if (adjust_delta == 1.4013e-45) {
    local_54 = -local_54;
  }
  if ((((decimal_precision._2_1_ & 1) != 0) &&
      ((float)((long)format_local - v_max_local) < 3.4028235e+38)) &&
     (1e-06 < (float)((long)format_local - v_max_local))) {
    local_54 = local_54 / (float)((long)format_local - v_max_local);
  }
  local_9f = false;
  if (((decimal_precision._3_1_ & 1) != 0) &&
     (((long)*pdStack_18 < (long)format_local || (local_9f = true, local_54 <= 0.0)))) {
    local_9f = (long)*pdStack_18 <= v_max_local && local_54 < 0.0;
  }
  if (((pIStack_48->ActiveIdIsJustActivated & 1U) != 0) || (local_9f)) {
    pIStack_48->DragCurrentAccum = 0.0;
    pIStack_48->DragCurrentAccumDirty = false;
  }
  else if ((local_54 != 0.0) || (NAN(local_54))) {
    pIStack_48->DragCurrentAccum = local_54 + pIStack_48->DragCurrentAccum;
    pIStack_48->DragCurrentAccumDirty = true;
  }
  if ((pIStack_48->DragCurrentAccumDirty & 1U) == 0) {
    v_local._7_1_ = false;
  }
  else {
    v_00 = *pdStack_18;
    fVar4 = 0.0;
    decimal_precision_1 = 0;
    if ((decimal_precision._2_1_ & 1) == 0) {
      v_old_ref_for_accum_remainder = (double)((long)pIStack_48->DragCurrentAccum + (long)v_00);
    }
    else {
      if ((decimal_precision._1_1_ & 1) == 0) {
        local_a4 = 1;
      }
      else {
        local_a4 = ImParseFormatPrecision(pcStack_38,3);
      }
      decimal_precision_1 = (int)ImPow(0.1,(float)local_a4);
      fVar4 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)v_local,(longlong)v_00,v_max_local,(longlong)format_local,
                         (bool)(decimal_precision._2_1_ & 1),(float)decimal_precision_1,0.0);
      v_old_ref_for_accum_remainder =
           (double)ScaleValueFromRatioT<long_long,long_long,double>
                             ((ImGuiDataType)v_local,fVar4 + pIStack_48->DragCurrentAccum,
                              v_max_local,(longlong)format_local,(bool)(decimal_precision._2_1_ & 1)
                              ,(float)decimal_precision_1,0.0);
    }
    if ((g._4_4_ & 0x40) == 0) {
      v_old_ref_for_accum_remainder =
           (double)RoundScalarWithFormatT<long_long,long_long>
                             (pcStack_38,(ImGuiDataType)v_local,
                              (longlong)v_old_ref_for_accum_remainder);
    }
    pIStack_48->DragCurrentAccumDirty = false;
    if ((decimal_precision._2_1_ & 1) == 0) {
      pIStack_48->DragCurrentAccum =
           pIStack_48->DragCurrentAccum -
           (float)((long)v_old_ref_for_accum_remainder - (long)*pdStack_18);
    }
    else {
      fVar3 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)v_local,(longlong)v_old_ref_for_accum_remainder,v_max_local,
                         (longlong)format_local,(bool)(decimal_precision._2_1_ & 1),
                         (float)decimal_precision_1,0.0);
      pIStack_48->DragCurrentAccum = pIStack_48->DragCurrentAccum - (fVar3 - fVar4);
    }
    if (v_old_ref_for_accum_remainder == 0.0) {
      v_old_ref_for_accum_remainder = 0.0;
    }
    if ((*pdStack_18 != v_old_ref_for_accum_remainder) && ((decimal_precision._3_1_ & 1) != 0)) {
      if (((long)v_old_ref_for_accum_remainder < v_max_local) ||
         ((((long)*pdStack_18 < (long)v_old_ref_for_accum_remainder && (local_54 < 0.0)) &&
          ((decimal_precision._1_1_ & 1) == 0)))) {
        v_old_ref_for_accum_remainder = (double)v_max_local;
      }
      if (((long)format_local < (long)v_old_ref_for_accum_remainder) ||
         ((((long)v_old_ref_for_accum_remainder < (long)*pdStack_18 && (0.0 < local_54)) &&
          ((decimal_precision._1_1_ & 1) == 0)))) {
        v_old_ref_for_accum_remainder = (double)format_local;
      }
    }
    if (*pdStack_18 == v_old_ref_for_accum_remainder) {
      v_local._7_1_ = false;
    }
    else {
      *pdStack_18 = v_old_ref_for_accum_remainder;
      v_local._7_1_ = true;
    }
  }
  return v_local._7_1_;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}